

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_tidy.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  int local_24;
  int i;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  local_24 = 1;
  do {
    if (argc <= local_24) {
LAB_00101357:
      fprintf(_stderr,"1 warning generated.\n");
      return 0;
    }
    iVar1 = strcmp(argv[local_24],"-p");
    if (iVar1 == 0) {
      do {
        local_24 = local_24 + 1;
        if (argc <= local_24) {
          return 0;
        }
        iVar1 = strcmp(argv[local_24],"--");
      } while (iVar1 != 0);
      fprintf(_stderr,"Command line arguments unexpectedly appended\n");
      return 1;
    }
    iVar1 = strcmp(argv[local_24],"-bad");
    if (iVar1 == 0) {
      fprintf(_stdout,"stdout from bad command line arg \'-bad\'\n");
      fprintf(_stderr,"stderr from bad command line arg \'-bad\'\n");
      return 1;
    }
    iVar1 = strncmp(argv[local_24],"--export-fixes=",0xf);
    if (iVar1 == 0) {
      __stream = fopen(argv[local_24] + 0xf,"w");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"Error opening %s for writing\n",argv[local_24] + 0xf);
        return 1;
      }
      fclose(__stream);
    }
    if (*argv[local_24] != '-') {
      fprintf(_stdout,"%s:0:0: warning: message [checker]\n",argv[local_24]);
      goto LAB_00101357;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
  FILE* f;
  int i;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "-p") == 0) {
      // Ensure compile commands were not appended after the source file
      for (++i; i < argc; ++i) {
        if (strcmp(argv[i], "--") == 0) {
          fprintf(stderr, "Command line arguments unexpectedly appended\n");
          return 1;
        }
      }
      return 0;
    }
    if (strcmp(argv[i], "-bad") == 0) {
      fprintf(stdout, "stdout from bad command line arg '-bad'\n");
      fprintf(stderr, "stderr from bad command line arg '-bad'\n");
      return 1;
    }
    if (strncmp(argv[i], "--export-fixes=", 15) == 0) {
      f = fopen(argv[i] + 15, "w");
      if (!f) {
        fprintf(stderr, "Error opening %s for writing\n", argv[i] + 15);
        return 1;
      }
      fclose(f);
    }
    if (argv[i][0] != '-') {
      fprintf(stdout, "%s:0:0: warning: message [checker]\n", argv[i]);
      break;
    }
  }
  fprintf(stderr, "1 warning generated.\n");
  return 0;
}